

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ProcessRTPPacket
          (RTPSources *this,RTPPacket *rtppack,RTPTime *receivetime,RTPAddress *senderaddress,
          bool *stored)

{
  uint uVar1;
  RTPAddress *pRVar2;
  RTPMemoryManager *pRVar3;
  RTPInternalSourceData *pRVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool createdcsrc;
  bool created;
  int num;
  RTPInternalSourceData *csrcdat;
  RTPInternalSourceData *srcdat;
  uint32_t CSRCs [15];
  bool local_ae;
  byte local_ad;
  char local_ac;
  char local_ab;
  char local_aa;
  bool local_a9;
  RTPAddress *local_a8;
  RTPMemoryManager *local_a0;
  RTPInternalSourceData *local_98;
  RTPInternalSourceData *local_90;
  RTPTime *local_88;
  bool *local_80;
  uint32_t local_78 [18];
  
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])();
  *stored = false;
  iVar5 = ObtainSourceDataInstance(this,rtppack->ssrc,&local_90,&local_a9);
  pRVar4 = local_90;
  if (iVar5 < 0) {
    return iVar5;
  }
  local_88 = receivetime;
  local_80 = stored;
  if (local_a9 != true) {
    bVar12 = CheckCollision(this,local_90,senderaddress,true);
    uVar10 = 0;
    if (bVar12) {
      return 0;
    }
    goto LAB_0011e616;
  }
  if (senderaddress == (RTPAddress *)0x0) {
    pRVar2 = (local_90->super_RTPSourceData).rtpaddr;
    if (pRVar2 != (RTPAddress *)0x0) {
      local_a8 = (RTPAddress *)(local_90->super_RTPSourceData).super_RTPMemoryObject.mgr;
      if (local_a8 == (RTPAddress *)0x0) {
        (*pRVar2->_vptr_RTPAddress[4])(pRVar2);
      }
      else {
        (*pRVar2->_vptr_RTPAddress[3])(pRVar2);
        (**(code **)(*(long *)local_a8 + 0x18))(local_a8,pRVar2);
      }
      (pRVar4->super_RTPSourceData).rtpaddr = (RTPAddress *)0x0;
    }
LAB_0011e603:
    (pRVar4->super_RTPSourceData).isrtpaddrset = true;
    bVar12 = false;
    uVar10 = 0;
  }
  else {
    iVar5 = (**senderaddress->_vptr_RTPAddress)
                      (senderaddress,(local_90->super_RTPSourceData).super_RTPMemoryObject.mgr);
    local_a8 = (RTPAddress *)CONCAT44(extraout_var,iVar5);
    if (local_a8 != (RTPAddress *)0x0) {
      pRVar2 = (pRVar4->super_RTPSourceData).rtpaddr;
      if (pRVar2 != senderaddress && pRVar2 != (RTPAddress *)0x0) {
        pRVar3 = (pRVar4->super_RTPSourceData).super_RTPMemoryObject.mgr;
        if (pRVar3 == (RTPMemoryManager *)0x0) {
          (*pRVar2->_vptr_RTPAddress[4])(pRVar2);
        }
        else {
          local_a0 = pRVar3;
          (*pRVar2->_vptr_RTPAddress[3])(pRVar2);
          (**(code **)(*(long *)local_a0 + 0x18))(local_a0,pRVar2);
        }
      }
      (pRVar4->super_RTPSourceData).rtpaddr = local_a8;
      goto LAB_0011e603;
    }
    uVar10 = 0xffffffff;
    bVar12 = true;
  }
  if (bVar12) {
    return (int)uVar10;
  }
LAB_0011e616:
  local_aa = local_a9;
  local_ac = (local_90->super_RTPSourceData).issender;
  local_ad = (local_90->super_RTPSourceData).receivedbye;
  local_ab = (local_90->super_RTPSourceData).validated;
  uVar1 = rtppack->numcsrcs;
  uVar6 = 0xf;
  if ((int)uVar1 < 0xf) {
    uVar6 = uVar1;
  }
  local_a0 = (RTPMemoryManager *)CONCAT44(local_a0._4_4_,uVar6);
  local_a8 = senderaddress;
  if (0 < (int)uVar1) {
    uVar10 = 0;
    do {
      uVar7 = RTPPacket::GetCSRC(rtppack,(int)uVar10);
      local_78[uVar10] = uVar7;
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
  }
  iVar8 = (int)uVar10;
  iVar5 = RTPInternalSourceData::ProcessRTPPacket(local_90,rtppack,local_88,local_80,this);
  if (-1 < iVar5) {
    if ((local_ac == '\0') && ((local_90->super_RTPSourceData).issender == true)) {
      this->sendercount = this->sendercount + 1;
    }
    if ((((local_ab == '\0') || ((local_ad & 1) != 0)) &&
        ((local_90->super_RTPSourceData).validated == true)) &&
       (((local_90->super_RTPSourceData).receivedbye & 1U) == 0)) {
      this->activecount = this->activecount + 1;
    }
    if (local_aa != '\0') {
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_90);
    }
    if ((local_90->super_RTPSourceData).validated == true) {
      bVar12 = 0 < (int)uVar1;
      if ((0 < (int)uVar1) &&
         (iVar8 = ObtainSourceDataInstance(this,local_78[0],&local_98,&local_ae), -1 < iVar8)) {
        uVar11 = (ulong)local_a0 & 0xffffffff;
        uVar10 = 1;
        do {
          uVar9 = uVar10;
          pRVar4 = local_98;
          if (local_ae == true) {
            (local_98->super_RTPSourceData).validated = true;
            (local_98->super_RTPSourceData).iscsrc = true;
            if (((local_98->super_RTPSourceData).receivedbye & 1U) == 0) {
              this->activecount = this->activecount + 1;
            }
            (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_98);
          }
          else {
            bVar12 = CheckCollision(this,local_98,local_a8,true);
            if (!bVar12) {
              (pRVar4->super_RTPSourceData).validated = true;
              (pRVar4->super_RTPSourceData).iscsrc = true;
            }
          }
          if (uVar11 == uVar9) break;
          iVar8 = ObtainSourceDataInstance(this,local_78[uVar9],&local_98,&local_ae);
          uVar10 = uVar9 + 1;
        } while (-1 < iVar8);
        bVar12 = uVar9 < uVar11;
      }
      if (bVar12) {
        return iVar8;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int RTPSources::ProcessRTPPacket(RTPPacket *rtppack,const RTPTime &receivetime,const RTPAddress *senderaddress,bool *stored)
{
	uint32_t ssrc;
	RTPInternalSourceData *srcdat;
	int status;
	bool created;

	OnRTPPacket(rtppack,receivetime,senderaddress);

	*stored = false;
	
	ssrc = rtppack->GetSSRC();
	if ((status = ObtainSourceDataInstance(ssrc,&srcdat,&created)) < 0)
		return status;

	if (created)
	{
		if ((status = srcdat->SetRTPDataAddress(senderaddress)) < 0)
			return status;
	}
	else // got a previously existing source
	{
		if (CheckCollision(srcdat,senderaddress,true))
			return 0; // ignore packet on collision
	}
	
	bool prevsender = srcdat->IsSender();
	bool prevactive = srcdat->IsActive();
	
	uint32_t CSRCs[RTP_MAXCSRCS];
	int numCSRCs = rtppack->GetCSRCCount();
	if (numCSRCs > RTP_MAXCSRCS) // shouldn't happen, but better to check than go out of bounds
		numCSRCs = RTP_MAXCSRCS;

	for (int i = 0 ; i < numCSRCs ; i++)
		CSRCs[i] = rtppack->GetCSRC(i);

	// The packet comes from a valid source, we can process it further now
	// The following function should delete rtppack itself if something goes
	// wrong
	if ((status = srcdat->ProcessRTPPacket(rtppack,receivetime,stored,this)) < 0)
		return status;

	// NOTE: we cannot use 'rtppack' anymore since it may have been deleted in
	//       OnValidatedRTPPacket

	if (!prevsender && srcdat->IsSender())
		sendercount++;
	if (!prevactive && srcdat->IsActive())
		activecount++;

	if (created)
		OnNewSource(srcdat);

	if (srcdat->IsValidated()) // process the CSRCs
	{
		RTPInternalSourceData *csrcdat;
		bool createdcsrc;

		int num = numCSRCs;
		int i;

		for (i = 0 ; i < num ; i++)
		{
			if ((status = ObtainSourceDataInstance(CSRCs[i],&csrcdat,&createdcsrc)) < 0)
				return status;
			if (createdcsrc)
			{
				csrcdat->SetCSRC();
				if (csrcdat->IsActive())
					activecount++;
				OnNewSource(csrcdat);
			}
			else // already found an entry, possibly because of RTCP data
			{
				if (!CheckCollision(csrcdat,senderaddress,true))
					csrcdat->SetCSRC();
			}
		}
	}
	
	return 0;
}